

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O0

void u8_to_U_test(int line,UTF_S8 *str1,UTF_US32 *str2,bool ok)

{
  bool bVar1;
  UTF_RET UVar2;
  int iVar3;
  UTF_C8 *j8;
  size_t j8size;
  char32_t *uj32a;
  size_type sVar4;
  UTF_UC32 local_448 [2];
  UTF_UC32 buf [256];
  UTF_US32 tmp;
  bool ok_local;
  UTF_US32 *str2_local;
  UTF_S8 *str1_local;
  int line_local;
  
  std::__cxx11::u32string::u32string((u32string *)(buf + 0xfe));
  bVar1 = UTF_u8_to_U<(char)63>(str1,(UTF_US32 *)(buf + 0xfe));
  UTF_test(line,bVar1 == ok);
  bVar1 = std::operator==((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                           *)(buf + 0xfe),str2);
  UTF_test(line,bVar1);
  j8 = (UTF_C8 *)std::__cxx11::string::c_str();
  j8size = std::__cxx11::string::size();
  UVar2 = UTF_j8_to_uj32(j8,j8size,local_448,0x100);
  UTF_test(line,UVar2 == UTF_SUCCESS);
  uj32a = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::c_str
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)(buf + 0xfe));
  sVar4 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)(buf + 0xfe));
  iVar3 = UTF_uj32_cmpn(uj32a,local_448,sVar4 + 1);
  UTF_test(line,iVar3 == 0);
  std::__cxx11::u32string::~u32string((u32string *)(buf + 0xfe));
  return;
}

Assistant:

void u8_to_U_test(int line, const UTF_S8& str1, const UTF_US32& str2, bool ok)
{
    UTF_US32 tmp;
    UTF_UC32 buf[256];
    UTF_test(line, UTF_u8_to_U<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_j8_to_uj32(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj32_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}